

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void transpose16x32_avx2(__m256i *x,__m256i *d)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256i alVar15;
  
  auVar1 = vpunpcklbw_avx2((undefined1  [32])*x,(undefined1  [32])x[1]);
  auVar2 = vpunpcklbw_avx2((undefined1  [32])x[2],(undefined1  [32])x[3]);
  auVar3 = vpunpcklbw_avx2((undefined1  [32])x[4],(undefined1  [32])x[5]);
  auVar4 = vpunpcklbw_avx2((undefined1  [32])x[6],(undefined1  [32])x[7]);
  auVar5 = vpunpcklbw_avx2((undefined1  [32])x[8],(undefined1  [32])x[9]);
  auVar6 = vpunpcklbw_avx2((undefined1  [32])x[10],(undefined1  [32])x[0xb]);
  auVar7 = vpunpcklbw_avx2((undefined1  [32])x[0xc],(undefined1  [32])x[0xd]);
  auVar8 = vpunpcklbw_avx2((undefined1  [32])x[0xe],(undefined1  [32])x[0xf]);
  auVar9 = vpunpcklwd_avx2(auVar1,auVar2);
  auVar10 = vpunpcklwd_avx2(auVar3,auVar4);
  auVar11 = vpunpcklwd_avx2(auVar5,auVar6);
  auVar12 = vpunpcklwd_avx2(auVar7,auVar8);
  auVar13 = vpunpckldq_avx2(auVar9,auVar10);
  auVar9 = vpunpckhdq_avx2(auVar9,auVar10);
  auVar14 = vpunpckldq_avx2(auVar11,auVar12);
  auVar10 = vpunpckhdq_avx2(auVar11,auVar12);
  alVar15 = (__m256i)vpunpcklqdq_avx2(auVar13,auVar14);
  *d = alVar15;
  alVar15 = (__m256i)vpunpckhqdq_avx2(auVar13,auVar14);
  d[1] = alVar15;
  alVar15 = (__m256i)vpunpcklqdq_avx2(auVar9,auVar10);
  d[2] = alVar15;
  alVar15 = (__m256i)vpunpckhqdq_avx2(auVar9,auVar10);
  d[3] = alVar15;
  auVar9 = vpunpckhwd_avx2(auVar1,auVar2);
  auVar10 = vpunpckhwd_avx2(auVar3,auVar4);
  auVar1 = vpunpckhwd_avx2(auVar5,auVar6);
  auVar2 = vpunpckhwd_avx2(auVar7,auVar8);
  auVar3 = vpunpckldq_avx2(auVar9,auVar10);
  auVar9 = vpunpckhdq_avx2(auVar9,auVar10);
  auVar4 = vpunpckldq_avx2(auVar1,auVar2);
  auVar10 = vpunpckhdq_avx2(auVar1,auVar2);
  alVar15 = (__m256i)vpunpcklqdq_avx2(auVar3,auVar4);
  d[4] = alVar15;
  alVar15 = (__m256i)vpunpckhqdq_avx2(auVar3,auVar4);
  d[5] = alVar15;
  alVar15 = (__m256i)vpunpcklqdq_avx2(auVar9,auVar10);
  d[6] = alVar15;
  alVar15 = (__m256i)vpunpckhqdq_avx2(auVar9,auVar10);
  d[7] = alVar15;
  auVar9 = vpunpckhbw_avx2((undefined1  [32])*x,(undefined1  [32])x[1]);
  auVar10 = vpunpckhbw_avx2((undefined1  [32])x[2],(undefined1  [32])x[3]);
  auVar1 = vpunpckhbw_avx2((undefined1  [32])x[4],(undefined1  [32])x[5]);
  auVar2 = vpunpckhbw_avx2((undefined1  [32])x[6],(undefined1  [32])x[7]);
  auVar3 = vpunpckhbw_avx2((undefined1  [32])x[8],(undefined1  [32])x[9]);
  auVar4 = vpunpckhbw_avx2((undefined1  [32])x[10],(undefined1  [32])x[0xb]);
  auVar5 = vpunpckhbw_avx2((undefined1  [32])x[0xc],(undefined1  [32])x[0xd]);
  auVar6 = vpunpckhbw_avx2((undefined1  [32])x[0xe],(undefined1  [32])x[0xf]);
  auVar7 = vpunpcklwd_avx2(auVar9,auVar10);
  auVar8 = vpunpcklwd_avx2(auVar1,auVar2);
  auVar11 = vpunpcklwd_avx2(auVar3,auVar4);
  auVar12 = vpunpcklwd_avx2(auVar5,auVar6);
  auVar13 = vpunpckldq_avx2(auVar7,auVar8);
  auVar7 = vpunpckhdq_avx2(auVar7,auVar8);
  auVar14 = vpunpckldq_avx2(auVar11,auVar12);
  auVar8 = vpunpckhdq_avx2(auVar11,auVar12);
  alVar15 = (__m256i)vpunpcklqdq_avx2(auVar13,auVar14);
  d[8] = alVar15;
  alVar15 = (__m256i)vpunpckhqdq_avx2(auVar13,auVar14);
  d[9] = alVar15;
  alVar15 = (__m256i)vpunpcklqdq_avx2(auVar7,auVar8);
  d[10] = alVar15;
  alVar15 = (__m256i)vpunpckhqdq_avx2(auVar7,auVar8);
  d[0xb] = alVar15;
  auVar9 = vpunpckhwd_avx2(auVar9,auVar10);
  auVar10 = vpunpckhwd_avx2(auVar1,auVar2);
  auVar1 = vpunpckhwd_avx2(auVar3,auVar4);
  auVar2 = vpunpckhwd_avx2(auVar5,auVar6);
  auVar3 = vpunpckldq_avx2(auVar9,auVar10);
  auVar9 = vpunpckhdq_avx2(auVar9,auVar10);
  auVar4 = vpunpckldq_avx2(auVar1,auVar2);
  auVar10 = vpunpckhdq_avx2(auVar1,auVar2);
  alVar15 = (__m256i)vpunpcklqdq_avx2(auVar3,auVar4);
  d[0xc] = alVar15;
  alVar15 = (__m256i)vpunpckhqdq_avx2(auVar3,auVar4);
  d[0xd] = alVar15;
  alVar15 = (__m256i)vpunpcklqdq_avx2(auVar9,auVar10);
  d[0xe] = alVar15;
  alVar15 = (__m256i)vpunpckhqdq_avx2(auVar9,auVar10);
  d[0xf] = alVar15;
  return;
}

Assistant:

static inline void transpose16x32_avx2(__m256i *x, __m256i *d) {
  __m256i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9;
  __m256i w10, w11, w12, w13, w14, w15;

  w0 = _mm256_unpacklo_epi8(x[0], x[1]);
  w1 = _mm256_unpacklo_epi8(x[2], x[3]);
  w2 = _mm256_unpacklo_epi8(x[4], x[5]);
  w3 = _mm256_unpacklo_epi8(x[6], x[7]);

  w8 = _mm256_unpacklo_epi8(x[8], x[9]);
  w9 = _mm256_unpacklo_epi8(x[10], x[11]);
  w10 = _mm256_unpacklo_epi8(x[12], x[13]);
  w11 = _mm256_unpacklo_epi8(x[14], x[15]);

  w4 = _mm256_unpacklo_epi16(w0, w1);
  w5 = _mm256_unpacklo_epi16(w2, w3);
  w12 = _mm256_unpacklo_epi16(w8, w9);
  w13 = _mm256_unpacklo_epi16(w10, w11);

  w6 = _mm256_unpacklo_epi32(w4, w5);
  w7 = _mm256_unpackhi_epi32(w4, w5);
  w14 = _mm256_unpacklo_epi32(w12, w13);
  w15 = _mm256_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  d[0] = _mm256_unpacklo_epi64(w6, w14);
  d[1] = _mm256_unpackhi_epi64(w6, w14);
  d[2] = _mm256_unpacklo_epi64(w7, w15);
  d[3] = _mm256_unpackhi_epi64(w7, w15);

  w4 = _mm256_unpackhi_epi16(w0, w1);
  w5 = _mm256_unpackhi_epi16(w2, w3);
  w12 = _mm256_unpackhi_epi16(w8, w9);
  w13 = _mm256_unpackhi_epi16(w10, w11);

  w6 = _mm256_unpacklo_epi32(w4, w5);
  w7 = _mm256_unpackhi_epi32(w4, w5);
  w14 = _mm256_unpacklo_epi32(w12, w13);
  w15 = _mm256_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  d[4] = _mm256_unpacklo_epi64(w6, w14);
  d[5] = _mm256_unpackhi_epi64(w6, w14);
  d[6] = _mm256_unpacklo_epi64(w7, w15);
  d[7] = _mm256_unpackhi_epi64(w7, w15);

  // upper half
  w0 = _mm256_unpackhi_epi8(x[0], x[1]);
  w1 = _mm256_unpackhi_epi8(x[2], x[3]);
  w2 = _mm256_unpackhi_epi8(x[4], x[5]);
  w3 = _mm256_unpackhi_epi8(x[6], x[7]);

  w8 = _mm256_unpackhi_epi8(x[8], x[9]);
  w9 = _mm256_unpackhi_epi8(x[10], x[11]);
  w10 = _mm256_unpackhi_epi8(x[12], x[13]);
  w11 = _mm256_unpackhi_epi8(x[14], x[15]);

  w4 = _mm256_unpacklo_epi16(w0, w1);
  w5 = _mm256_unpacklo_epi16(w2, w3);
  w12 = _mm256_unpacklo_epi16(w8, w9);
  w13 = _mm256_unpacklo_epi16(w10, w11);

  w6 = _mm256_unpacklo_epi32(w4, w5);
  w7 = _mm256_unpackhi_epi32(w4, w5);
  w14 = _mm256_unpacklo_epi32(w12, w13);
  w15 = _mm256_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  d[8] = _mm256_unpacklo_epi64(w6, w14);
  d[9] = _mm256_unpackhi_epi64(w6, w14);
  d[10] = _mm256_unpacklo_epi64(w7, w15);
  d[11] = _mm256_unpackhi_epi64(w7, w15);

  w4 = _mm256_unpackhi_epi16(w0, w1);
  w5 = _mm256_unpackhi_epi16(w2, w3);
  w12 = _mm256_unpackhi_epi16(w8, w9);
  w13 = _mm256_unpackhi_epi16(w10, w11);

  w6 = _mm256_unpacklo_epi32(w4, w5);
  w7 = _mm256_unpackhi_epi32(w4, w5);
  w14 = _mm256_unpacklo_epi32(w12, w13);
  w15 = _mm256_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  d[12] = _mm256_unpacklo_epi64(w6, w14);
  d[13] = _mm256_unpackhi_epi64(w6, w14);
  d[14] = _mm256_unpacklo_epi64(w7, w15);
  d[15] = _mm256_unpackhi_epi64(w7, w15);
}